

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture2DShadowProjGradOffset
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float lod;
  float fVar4;
  IVec2 local_18;
  
  fVar4 = c->in[0].m_data[2];
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  lod = computeLodFromGrad2D(c);
  local_18.m_data = *(int (*) [2])(p->offset).m_data;
  fVar4 = texture2DShadowOffset(c,fVar4 / fVar1,fVar2 / fVar1,fVar3 / fVar1,lod,&local_18);
  (c->color).m_data[0] = fVar4;
  return;
}

Assistant:

static void		evalTexture2DShadowProjGradOffset	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), computeLodFromGrad2D(c), p.offset.swizzle(0,1)); }